

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D5xNvmFlash.cpp
# Opt level: O2

void __thiscall D5xNvmFlash::writeOptions(D5xNvmFlash *this)

{
  WordCopyApplet *this_00;
  bool *pbVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  byte bVar5;
  _Bvector_impl *p_Var6;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> uVar7;
  bool bVar8;
  const_reference cVar9;
  uint16_t uVar10;
  int iVar11;
  uint uVar12;
  byte bVar13;
  _Bit_const_iterator __first1;
  _Bit_const_iterator __last1;
  _Bit_iterator __first2;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> userPage;
  vector<bool,_std::allocator<bool>_> current;
  
  userPage._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
  iVar11 = (*(this->super_Flash)._vptr_Flash[0x13])();
  if (((char)iVar11 != '\0') && ((this->super_Flash)._bor._dirty == true)) {
    bVar8 = (this->super_Flash)._bor._value;
    iVar11 = (*(this->super_Flash)._vptr_Flash[0x11])(this);
    if (bVar8 != (bool)(char)iVar11) {
      readUserPage(this,&userPage);
      *(byte *)((long)userPage._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1) =
           (this->super_Flash)._bor._value * '\x02' |
           *(byte *)((long)userPage._M_t.
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1) & 0xfd;
    }
  }
  iVar11 = (*(this->super_Flash)._vptr_Flash[0x10])(this);
  if (((char)iVar11 != '\0') && ((this->super_Flash)._bod._dirty == true)) {
    bVar8 = (this->super_Flash)._bod._value;
    iVar11 = (*(this->super_Flash)._vptr_Flash[0xe])(this);
    if (bVar8 != (bool)(char)iVar11) {
      readUserPage(this,&userPage);
      *(byte *)userPage._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (*(byte *)userPage._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl & 0xfe |
           (this->super_Flash)._bod._value) ^ 1;
    }
  }
  if ((this->super_Flash)._regions._dirty == true) {
    (*(this->super_Flash)._vptr_Flash[10])(&current);
    p_Var6 = &(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>._M_impl
    ;
    uVar3 = (p_Var6->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
    uVar4 = (p_Var6->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
    __last1.super__Bit_iterator_base._M_offset = uVar4;
    __last1.super__Bit_iterator_base._M_p = (_Bit_type *)uVar3;
    __first1.super__Bit_iterator_base._8_8_ = 0;
    __first1.super__Bit_iterator_base._M_p =
         (this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p =
         current.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    bVar8 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_iterator>
                      (__first1,__last1,__first2);
    if (!bVar8) {
      readUserPage(this,&userPage);
      uVar7 = userPage;
      for (uVar12 = 0;
          (ulong)uVar12 <
          (ulong)(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                 _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                 _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          (long)(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
          uVar12 = uVar12 + 1) {
        cVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (&(this->super_Flash)._regions._value,(ulong)uVar12);
        bVar2 = *(byte *)((long)uVar7._M_t.
                                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 8 +
                         (ulong)(uVar12 >> 3));
        bVar13 = (byte)(1 << ((byte)uVar12 & 7));
        bVar5 = ~bVar13 & bVar2;
        if (!cVar9) {
          bVar5 = bVar2 | bVar13;
        }
        *(byte *)((long)uVar7._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 8 +
                 (ulong)(uVar12 >> 3)) = bVar5;
      }
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&current.super__Bvector_base<std::allocator<bool>_>);
  }
  if ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
      userPage._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
      .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
    uVar10 = readRegU16(this,'\0');
    writeRegU16(this,'\0',uVar10 & 0x3fcf | 0xc000);
    writeRegU32(this,'\x14',0x804000);
    command(this,'\0');
    this_00 = &(this->super_Flash)._wordCopy;
    for (uVar12 = 0; uVar12 < (this->super_Flash)._size; uVar12 = uVar12 + 0x10) {
      (*(this->super_Flash)._vptr_Flash[0x1b])
                (this,(ulong)uVar12 +
                      (long)userPage._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0x10);
      command(this,'\x15');
      WordCopyApplet::setDstAddr(this_00,uVar12 + 0x804000);
      WordCopyApplet::setSrcAddr
                (this_00,(&(this->super_Flash)._pageBufferA)[(this->super_Flash)._onBufferA ^ 1]);
      WordCopyApplet::setWords(this_00,4);
      pbVar1 = &(this->super_Flash)._onBufferA;
      *pbVar1 = (bool)(*pbVar1 ^ 1);
      waitReady(this);
      Applet::runv(&this_00->super_Applet);
      writeRegU32(this,'\x14',uVar12 + 0x804000);
      command(this,'\x04');
    }
  }
  if (((this->super_Flash)._security._dirty == true) &&
     ((this->super_Flash)._security._value == true)) {
    iVar11 = (*(this->super_Flash)._vptr_Flash[0xc])(this);
    if ((char)iVar11 != '\x01') {
      command(this,'\x16');
    }
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&userPage);
  return;
}

Assistant:

void
D5xNvmFlash::writeOptions()
{
    std::unique_ptr<uint8_t[]> userPage;

    if (canBor() && _bor.isDirty() && _bor.get() != getBor())
    {
        readUserPage(userPage);
        if (_bor.get())
            userPage[NVM_UP_BOD33_RESET_OFFSET] |= NVM_UP_BOD33_RESET_MASK;
        else
            userPage[NVM_UP_BOD33_RESET_OFFSET] &= ~NVM_UP_BOD33_RESET_MASK;
    }
    if (canBod() && _bod.isDirty() && _bod.get() != getBod())
    {
        readUserPage(userPage);
        if (_bod.get())
            userPage[NVM_UP_BOD33_DISABLE_OFFSET] &= ~NVM_UP_BOD33_DISABLE_MASK;
        else
            userPage[NVM_UP_BOD33_DISABLE_OFFSET] |= NVM_UP_BOD33_DISABLE_MASK;
    }
    if (_regions.isDirty())
    {
        // Check if any lock bits are different from the current set
        std::vector<bool> current = getLockRegions();
        if (!equal(_regions.get().begin(), _regions.get().end(), current.begin()))
        {
            readUserPage(userPage);

            uint8_t* lockBits = &userPage[NVM_UP_NVM_LOCK_OFFSET];
            for (uint32_t region = 0; region < _regions.get().size(); region++)
            {
                if (_regions.get()[region])
                    lockBits[region / 8] &= ~(1 << (region % 8));
                else
                    lockBits[region / 8] |= (1 << (region % 8));
            }
        }
    }

    // Erase and write the user page if modified
    if (userPage)
    {
        // Configure manual page write and disable caches
        writeRegU16(NVM_REG_CTRLA, (readRegU16(NVM_REG_CTRLA) | (0x3 << 14)) & 0xffcf);

        // Erase user page
        writeRegU32(NVM_REG_ADDR, NVM_UP_ADDR);
        command(NVM_CMD_EP);

        // Write user page in quad-word chunks
        for (uint32_t offset = 0; offset < NVM_UP_SIZE; offset += 16)
        {
            // Load the buffer with the quad word
            loadBuffer(&userPage[offset], 16);

            // Clear page buffer
            command(NVM_CMD_PBC);

            // Copy quad word to page buffer
            _wordCopy.setDstAddr(NVM_UP_ADDR + offset);
            _wordCopy.setSrcAddr(_onBufferA ? _pageBufferA : _pageBufferB);
            _wordCopy.setWords(4);
            _onBufferA = !_onBufferA;
            waitReady();
            _wordCopy.runv();

            // Write the quad word
            writeRegU32(NVM_REG_ADDR, NVM_UP_ADDR + offset);
            command(NVM_CMD_WQW);
        }
    }

    // Always do security last
    if (_security.isDirty() && _security.get() == true && _security.get() != getSecurity())
    {
        command(NVM_CMD_SSB);
    }
}